

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O3

char * google::protobuf::internal::UTF8CoerceToStructurallyValid
                 (StringPiece *src_str,char *idst,char replace_char)

{
  char *__src;
  stringpiece_ssize_type sVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  int local_3c;
  char *local_38;
  
  __src = src_str->ptr_;
  sVar1 = src_str->length_;
  iVar3 = UTF8SpnStructurallyValid(src_str);
  iVar5 = (int)sVar1;
  local_38 = __src;
  if (iVar3 != iVar5) {
    sVar6 = (size_t)iVar3;
    memmove(idst,__src,sVar6);
    bVar2 = (anonymous_namespace)::module_initialized_;
    local_38 = idst;
    if ((long)sVar6 < (long)iVar5) {
      pcVar4 = __src + sVar6;
      pcVar7 = idst + sVar6;
      do {
        *pcVar7 = replace_char;
        pcVar4 = pcVar4 + 1;
        iVar3 = (int)(__src + iVar5) - (int)pcVar4;
        if ((bVar2 & 1) != 0) {
          local_3c = 0;
          UTF8GenericScanFastAscii
                    ((UTF8ScanObj *)utf8acceptnonsurrogates_obj,pcVar4,iVar3,&local_3c);
          iVar3 = local_3c;
        }
        sVar6 = (size_t)iVar3;
        memmove(pcVar7 + 1,pcVar4,sVar6);
        pcVar4 = pcVar4 + sVar6;
        pcVar7 = pcVar7 + 1 + sVar6;
      } while (pcVar4 < __src + iVar5);
    }
  }
  return local_38;
}

Assistant:

char* UTF8CoerceToStructurallyValid(const StringPiece& src_str,
                                    char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}